

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int aom_denoise_and_model_run
              (aom_denoise_and_model_t *ctx,YV12_BUFFER_CONFIG *sd,aom_film_grain_t *film_grain,
              int apply_denoise)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  aom_noise_status_t aVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  void *__dest;
  YV12_BUFFER_CONFIG *sd_00;
  int in_ECX;
  aom_noise_model_t *in_RDX;
  long in_RSI;
  int *in_RDI;
  int *in_stack_00000020;
  uint8_t *in_stack_00000028;
  int in_stack_00000030;
  int have_noise_estimate;
  aom_noise_status_t status;
  int chroma_sub_log2 [2];
  int strides [3];
  uint8_t *data [3];
  int in_stack_00000088;
  int in_stack_0000008c;
  uint8_t *raw_data [3];
  int in_stack_000000a8;
  int in_stack_000000b0;
  int use_highbd;
  int block_size;
  aom_noise_model_t *noise_model;
  void *local_b0;
  float in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  byte bVar9;
  int local_c;
  
  iVar8 = *in_RDI;
  uVar6 = (uint)((*(uint *)(in_RSI + 0xc0) & 8) != 0);
  if (uVar6 == 0) {
    __dest = *(void **)(in_RSI + 0x28);
    local_b0 = *(void **)(in_RSI + 0x30);
  }
  else {
    __dest = (void *)(*(long *)(in_RSI + 0x28) << 1);
    local_b0 = (void *)(*(long *)(in_RSI + 0x30) << 1);
  }
  if (uVar6 == 0) {
    sd_00 = *(YV12_BUFFER_CONFIG **)(in_RSI + 0x38);
  }
  else {
    sd_00 = (YV12_BUFFER_CONFIG *)(*(long *)(in_RSI + 0x38) << 1);
  }
  iVar1 = *(int *)(in_RSI + 0x20);
  iVar2 = *(int *)(in_RSI + 0x24);
  iVar3 = *(int *)(in_RSI + 0x24);
  iVar7 = denoise_and_model_realloc_if_necessary
                    ((aom_denoise_and_model_t *)&stack0xffffffffffffffb8,sd_00);
  if (iVar7 == 0) {
    fprintf(_stderr,"Unable to realloc buffers\n");
    local_c = 0;
  }
  else {
    aom_flat_block_finder_run
              ((aom_flat_block_finder_t *)raw_data[1],raw_data[0],in_stack_0000008c,
               in_stack_00000088,data[2]._4_4_,(uint8_t *)CONCAT44(data[1]._4_4_,(int)data[1]));
    iVar7 = aom_wiener_denoise_2d
                      ((uint8_t **)CONCAT44(in_stack_0000008c,in_stack_00000088),
                       (uint8_t **)CONCAT44(data[2]._4_4_,data[2]._0_4_),data[1]._4_4_,(int)data[1],
                       (int *)data[0],(int *)strides._4_8_,(float **)raw_data[2],in_stack_000000a8,
                       in_stack_000000b0,block_size);
    if (iVar7 == 0) {
      fprintf(_stderr,"Unable to denoise image\n");
      local_c = 0;
    }
    else {
      noise_model = *(aom_noise_model_t **)(in_RDI + 0x16);
      aVar5 = aom_noise_model_update
                        (in_RDX,(uint8_t **)CONCAT44(in_ECX,iVar8),
                         (uint8_t **)CONCAT44(uVar6,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc4,(int)in_stack_ffffffffffffffc0,(int *)sd_00,
                         in_stack_00000020,in_stack_00000028,in_stack_00000030);
      bVar9 = (byte)uVar6;
      if (aVar5 == '\0') {
        bVar4 = true;
      }
      else if (aVar5 == '\x03') {
        aom_noise_model_save_latest(noise_model);
        bVar4 = true;
      }
      else {
        bVar4 = 0 < in_RDI[0x3b];
      }
      *(undefined4 *)&in_RDX->params = 0;
      if (bVar4) {
        iVar8 = aom_noise_model_get_grain_parameters
                          ((aom_noise_model_t *)raw_data[1],(aom_film_grain_t *)raw_data[0]);
        if (iVar8 == 0) {
          fprintf(_stderr,"Unable to get grain parameters.\n");
          return 0;
        }
        if (*(short *)((long)&in_RDX->latest_state[2].strength_solver.min_intensity + 4) == 0) {
          *(undefined2 *)((long)&in_RDX->latest_state[2].strength_solver.min_intensity + 4) = 0x1cdf
          ;
        }
        if ((in_ECX != 0) &&
           (memcpy(__dest,*(void **)(in_RDI + 0x10),
                   (long)(iVar1 * *(int *)(in_RSI + 8) << (bVar9 & 0x1f))),
           *(char *)(in_RSI + 0xa8) == '\0')) {
          memcpy(local_b0,*(void **)(in_RDI + 0x12),
                 (long)(iVar2 * *(int *)(in_RSI + 0xc) << (bVar9 & 0x1f)));
          memcpy(sd_00,*(void **)(in_RDI + 0x14),
                 (long)(iVar3 * *(int *)(in_RSI + 0xc) << (bVar9 & 0x1f)));
        }
      }
      local_c = 1;
    }
  }
  return local_c;
}

Assistant:

int aom_denoise_and_model_run(struct aom_denoise_and_model_t *ctx,
                              const YV12_BUFFER_CONFIG *sd,
                              aom_film_grain_t *film_grain, int apply_denoise) {
  const int block_size = ctx->block_size;
  const int use_highbd = (sd->flags & YV12_FLAG_HIGHBITDEPTH) != 0;
  uint8_t *raw_data[3] = {
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->y_buffer) : sd->y_buffer,
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->u_buffer) : sd->u_buffer,
    use_highbd ? (uint8_t *)CONVERT_TO_SHORTPTR(sd->v_buffer) : sd->v_buffer,
  };
  const uint8_t *const data[3] = { raw_data[0], raw_data[1], raw_data[2] };
  int strides[3] = { sd->y_stride, sd->uv_stride, sd->uv_stride };
  int chroma_sub_log2[2] = { sd->subsampling_x, sd->subsampling_y };

  if (!denoise_and_model_realloc_if_necessary(ctx, sd)) {
    fprintf(stderr, "Unable to realloc buffers\n");
    return 0;
  }

  aom_flat_block_finder_run(&ctx->flat_block_finder, data[0], sd->y_width,
                            sd->y_height, strides[0], ctx->flat_blocks);

  if (!aom_wiener_denoise_2d(data, ctx->denoised, sd->y_width, sd->y_height,
                             strides, chroma_sub_log2, ctx->noise_psd,
                             block_size, ctx->bit_depth, use_highbd)) {
    fprintf(stderr, "Unable to denoise image\n");
    return 0;
  }

  const aom_noise_status_t status = aom_noise_model_update(
      &ctx->noise_model, data, (const uint8_t *const *)ctx->denoised,
      sd->y_width, sd->y_height, strides, chroma_sub_log2, ctx->flat_blocks,
      block_size);
  int have_noise_estimate = 0;
  if (status == AOM_NOISE_STATUS_OK) {
    have_noise_estimate = 1;
  } else if (status == AOM_NOISE_STATUS_DIFFERENT_NOISE_TYPE) {
    aom_noise_model_save_latest(&ctx->noise_model);
    have_noise_estimate = 1;
  } else {
    // Unable to update noise model; proceed if we have a previous estimate.
    have_noise_estimate =
        (ctx->noise_model.combined_state[0].strength_solver.num_equations > 0);
  }

  film_grain->apply_grain = 0;
  if (have_noise_estimate) {
    if (!aom_noise_model_get_grain_parameters(&ctx->noise_model, film_grain)) {
      fprintf(stderr, "Unable to get grain parameters.\n");
      return 0;
    }
    if (!film_grain->random_seed) {
      film_grain->random_seed = 7391;
    }
    if (apply_denoise) {
      memcpy(raw_data[0], ctx->denoised[0],
             (strides[0] * sd->y_height) << use_highbd);
      if (!sd->monochrome) {
        memcpy(raw_data[1], ctx->denoised[1],
               (strides[1] * sd->uv_height) << use_highbd);
        memcpy(raw_data[2], ctx->denoised[2],
               (strides[2] * sd->uv_height) << use_highbd);
      }
    }
  }
  return 1;
}